

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O1

bool __thiscall QEvdevTabletHandler::queryLimits(QEvdevTabletHandler *this)

{
  QEvdevTabletData *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  char name [128];
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  char *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char local_b8 [24];
  char *pcStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uVar6 = ioctl(this->m_fd,0x80184540);
  if (-1 < (int)uVar6) {
    pQVar1 = this->d;
    (pQVar1->minValues).x = local_d8._4_4_;
    (pQVar1->maxValues).x = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = '\0';
      local_b8[9] = '\0';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar9 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min X: %d max X: %d",uVar9,
                 (ulong)(uint)(this->d->minValues).x,(ulong)(uint)(this->d->maxValues).x);
    }
  }
  uVar7 = ioctl(this->m_fd,0x80184541,&local_d8);
  if (-1 < (int)(uVar7 | uVar6)) {
    pQVar1 = this->d;
    (pQVar1->minValues).y = local_d8._4_4_;
    (pQVar1->maxValues).y = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = '\0';
      local_b8[9] = '\0';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar9 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min Y: %d max Y: %d",uVar9,
                 (ulong)(uint)(this->d->minValues).y,(ulong)(uint)(this->d->maxValues).y);
    }
  }
  iVar8 = ioctl(this->m_fd,0x80184558,&local_d8);
  if (-1 < iVar8) {
    pQVar1 = this->d;
    (pQVar1->minValues).p = local_d8._4_4_;
    (pQVar1->maxValues).p = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = '\0';
      local_b8[9] = '\0';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar9 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min pressure: %d max pressure: %d",uVar9,
                 (ulong)(uint)(this->d->minValues).p,(ulong)(uint)(this->d->maxValues).p);
    }
  }
  iVar8 = ioctl(this->m_fd,0x80184559,&local_d8);
  if (-1 < iVar8) {
    pQVar1 = this->d;
    (pQVar1->minValues).d = local_d8._4_4_;
    (pQVar1->maxValues).d = (int)uStack_d0;
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = '\0';
      local_b8[9] = '\0';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar9 = QString::utf16();
      QMessageLogger::debug
                (local_b8,"evdevtablet: %ls: min distance: %d max distance: %d",uVar9,
                 (ulong)(uint)(this->d->minValues).d,(ulong)(uint)(this->d->maxValues).d);
    }
  }
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  local_b8[0x14] = -0x56;
  local_b8[0x15] = -0x56;
  local_b8[0x16] = -0x56;
  local_b8[0x17] = -0x56;
  pcStack_a0 = (char *)0xaaaaaaaaaaaaaaaa;
  local_b8[0] = -0x56;
  local_b8[1] = -0x56;
  local_b8[2] = -0x56;
  local_b8[3] = -0x56;
  local_b8[4] = -0x56;
  local_b8[5] = -0x56;
  local_b8[6] = -0x56;
  local_b8[7] = -0x56;
  local_b8[8] = -0x56;
  local_b8[9] = -0x56;
  local_b8[10] = -0x56;
  local_b8[0xb] = -0x56;
  local_b8[0xc] = -0x56;
  local_b8[0xd] = -0x56;
  local_b8[0xe] = -0x56;
  local_b8[0xf] = -0x56;
  local_b8[0x10] = -0x56;
  local_b8[0x11] = -0x56;
  local_b8[0x12] = -0x56;
  local_b8[0x13] = -0x56;
  iVar8 = ioctl(this->m_fd,0x807f4506,local_b8);
  if (-1 < iVar8) {
    puVar10 = (undefined1 *)memchr(local_b8,0,0x80);
    puVar11 = local_38;
    if (puVar10 != (undefined1 *)0x0) {
      puVar11 = puVar10;
    }
    QVar12.m_data = puVar11 + -(long)local_b8;
    QVar12.m_size = (qsizetype)&local_f8;
    QString::fromLocal8Bit(QVar12);
    pQVar1 = this->d;
    pQVar2 = &((pQVar1->devName).d.d)->super_QArrayData;
    pcVar3 = (pQVar1->devName).d.ptr;
    pDVar5 = (Data *)CONCAT44(uStack_f4,local_f8);
    local_f8 = SUB84(pQVar2,0);
    uStack_f4 = (undefined4)((ulong)pQVar2 >> 0x20);
    (pQVar1->devName).d.d = pDVar5;
    (pQVar1->devName).d.ptr = (char16_t *)CONCAT44(uStack_ec,uStack_f0);
    uStack_f0 = SUB84(pcVar3,0);
    uStack_ec = (undefined4)((ulong)pcVar3 >> 0x20);
    qVar4 = (pQVar1->devName).d.size;
    (pQVar1->devName).d.size = CONCAT44(uStack_e4,local_e8);
    local_e8 = (undefined4)qVar4;
    uStack_e4 = (undefined4)((ulong)qVar4 >> 0x20);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QtPrivateLogging::qLcEvdevTablet();
    if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      local_f8 = 2;
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_e8 = 0;
      uStack_e4 = 0;
      local_e0 = QtPrivateLogging::qLcEvdevTablet::category.name;
      uVar9 = QString::utf16();
      QMessageLogger::debug((char *)&local_f8,"evdevtablet: %ls: device name: %s",uVar9,local_b8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return -1 < (int)(uVar7 | uVar6);
  }
  __stack_chk_fail();
}

Assistant:

bool QEvdevTabletHandler::queryLimits()
{
    bool ok = true;
    input_absinfo absInfo;
    memset(&absInfo, 0, sizeof(input_absinfo));
    ok &= ioctl(m_fd, EVIOCGABS(ABS_X), &absInfo) >= 0;
    if (ok) {
        d->minValues.x = absInfo.minimum;
        d->maxValues.x = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min X: %d max X: %d", qUtf16Printable(m_device),
                d->minValues.x, d->maxValues.x);
    }
    ok &= ioctl(m_fd, EVIOCGABS(ABS_Y), &absInfo) >= 0;
    if (ok) {
        d->minValues.y = absInfo.minimum;
        d->maxValues.y = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min Y: %d max Y: %d", qUtf16Printable(m_device),
                d->minValues.y, d->maxValues.y);
    }
    if (ioctl(m_fd, EVIOCGABS(ABS_PRESSURE), &absInfo) >= 0) {
        d->minValues.p = absInfo.minimum;
        d->maxValues.p = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min pressure: %d max pressure: %d", qUtf16Printable(m_device),
                d->minValues.p, d->maxValues.p);
    }
    if (ioctl(m_fd, EVIOCGABS(ABS_DISTANCE), &absInfo) >= 0) {
        d->minValues.d = absInfo.minimum;
        d->maxValues.d = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min distance: %d max distance: %d", qUtf16Printable(m_device),
                d->minValues.d, d->maxValues.d);
    }
    char name[128];
    if (ioctl(m_fd, EVIOCGNAME(sizeof(name) - 1), name) >= 0) {
        d->devName = QString::fromLocal8Bit(name);
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: device name: %s", qUtf16Printable(m_device), name);
    }
    return ok;
}